

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapGraph.c
# Opt level: O0

Amap_Obj_t * Amap_ManCreateXor(Amap_Man_t *p,Amap_Obj_t *pFan0,Amap_Obj_t *pFan1)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Amap_Obj_t *pAVar4;
  Amap_Obj_t *pAVar5;
  Amap_Obj_t *pObj;
  Amap_Obj_t *pFan1_local;
  Amap_Obj_t *pFan0_local;
  Amap_Man_t *p_local;
  
  pAVar4 = Amap_ManSetupObj(p);
  *(ulong *)pAVar4 = *(ulong *)pAVar4 & 0xfffffffffffffff8 | 5;
  iVar1 = Amap_ObjToLit(pFan0);
  pAVar4->Fan[0] = iVar1;
  pAVar5 = Amap_Regular(pFan0);
  pAVar5->nRefs = pAVar5->nRefs + 1;
  iVar1 = Amap_ObjToLit(pFan1);
  pAVar4->Fan[1] = iVar1;
  pAVar5 = Amap_Regular(pFan1);
  pAVar5->nRefs = pAVar5->nRefs + 1;
  uVar2 = Amap_ObjPhaseReal(pFan0);
  uVar3 = Amap_ObjPhaseReal(pFan1);
  *(ulong *)pAVar4 = *(ulong *)pAVar4 & 0xdfffffffffffffff | ((ulong)(uVar2 ^ uVar3) & 1) << 0x3d;
  pAVar5 = Amap_Regular(pFan0);
  uVar2 = pAVar5->Level;
  pAVar5 = Amap_Regular(pFan1);
  iVar1 = Abc_MaxInt(uVar2,pAVar5->Level);
  pAVar4->Level = iVar1 + 2;
  if (p->nLevelMax < (int)pAVar4->Level) {
    p->nLevelMax = pAVar4->Level;
  }
  if (p->nLevelMax < 0xffe) {
    p->nObjs[5] = p->nObjs[5] + 1;
    return pAVar4;
  }
  __assert_fail("p->nLevelMax < 4094",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapGraph.c"
                ,0xb0,"Amap_Obj_t *Amap_ManCreateXor(Amap_Man_t *, Amap_Obj_t *, Amap_Obj_t *)");
}

Assistant:

Amap_Obj_t * Amap_ManCreateXor( Amap_Man_t * p, Amap_Obj_t * pFan0, Amap_Obj_t * pFan1 )
{
    Amap_Obj_t * pObj;
    pObj = Amap_ManSetupObj( p );
    pObj->Type   = AMAP_OBJ_XOR;
    pObj->Fan[0] = Amap_ObjToLit(pFan0);  Amap_Regular(pFan0)->nRefs++;
    pObj->Fan[1] = Amap_ObjToLit(pFan1);  Amap_Regular(pFan1)->nRefs++;
    pObj->fPhase = Amap_ObjPhaseReal(pFan0) ^ Amap_ObjPhaseReal(pFan1);
    pObj->Level  = 2 + Abc_MaxInt( Amap_Regular(pFan0)->Level, Amap_Regular(pFan1)->Level );
    if ( p->nLevelMax < (int)pObj->Level )
        p->nLevelMax = (int)pObj->Level;
    assert( p->nLevelMax < 4094 ); // 2^12-2
    p->nObjs[AMAP_OBJ_XOR]++;
    return pObj;
}